

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O2

void mqtt_client_dowork(MQTT_CLIENT_HANDLE handle)

{
  uint uVar1;
  int iVar2;
  tickcounter_ms_t in_RAX;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE handle_00;
  size_t length;
  uchar *data;
  STRING_HANDLE trace_log;
  MQTT_CLIENT *mqtt_client;
  tickcounter_ms_t current_ms;
  
  if (handle != (MQTT_CLIENT_HANDLE)0x0) {
    if (handle->xioHandle != (XIO_HANDLE)0x0) {
      if ((handle->mqtt_status & 4) == 0) {
        current_ms = in_RAX;
        xio_dowork(handle->xioHandle);
        uVar1._0_2_ = handle->mqtt_status;
        uVar1._2_2_ = handle->mqtt_flags;
        if (((~uVar1 & 3) == 0) && (handle->keepAliveInterval != 0)) {
          iVar2 = tickcounter_get_current_ms(handle->packetTickCntr,&current_ms);
          if (iVar2 == 0) {
            if ((handle->timeSincePing == 0) ||
               ((current_ms - handle->timeSincePing) / 1000 <= (ulong)handle->maxPingRespTime)) {
              if (((ulong)handle->keepAliveInterval <=
                   (current_ms - handle->packetSendTimeMs) / 1000) &&
                 (handle_00 = mqtt_codec_ping(), handle_00 != (BUFFER_HANDLE)0x0)) {
                length = BUFFER_length(handle_00);
                data = BUFFER_u_char(handle_00);
                sendPacketItem(handle,data,length);
                BUFFER_delete(handle_00);
                tickcounter_get_current_ms(handle->packetTickCntr,&handle->timeSincePing);
                if ((handle->mqtt_flags & 1) != 0) {
                  trace_log = STRING_construct("PINGREQ");
                  log_outgoing_trace(handle,trace_log);
                  STRING_delete(trace_log);
                }
              }
            }
            else {
              set_error_callback(handle,MQTT_CLIENT_NO_PING_RESPONSE);
              handle->timeSincePing = 0;
              handle->packetSendTimeMs = 0;
              handle->packetState = UNKNOWN_TYPE;
            }
          }
          else {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                        ,"mqtt_client_dowork",0x57f,1,"Error: tickcounter_get_current_ms failed");
            }
          }
        }
      }
      else {
        close_connection(handle);
        *(byte *)&handle->mqtt_status = (byte)handle->mqtt_status & 0xfb;
      }
    }
  }
  return;
}

Assistant:

void mqtt_client_dowork(MQTT_CLIENT_HANDLE handle)
{
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
    /*Codes_SRS_MQTT_CLIENT_18_001: [If the client is disconnected, mqtt_client_dowork shall do nothing.]*/
    /*Codes_SRS_MQTT_CLIENT_07_023: [If the parameter handle is NULL then mqtt_client_dowork shall do nothing.]*/
    if (mqtt_client != NULL && mqtt_client->xioHandle != NULL)
    {
        if (mqtt_client->mqtt_status & MQTT_STATUS_PENDING_CLOSE)
        {
            close_connection(mqtt_client);
            // turn off pending close
            mqtt_client->mqtt_status &= ~MQTT_STATUS_PENDING_CLOSE;
        }
        else
        {
            /*Codes_SRS_MQTT_CLIENT_07_024: [mqtt_client_dowork shall call the xio_dowork function to complete operations.]*/
            xio_dowork(mqtt_client->xioHandle);

            /*Codes_SRS_MQTT_CLIENT_07_025: [mqtt_client_dowork shall retrieve the the last packet send value and ...]*/
            if (mqtt_client->mqtt_status & MQTT_STATUS_SOCKET_CONNECTED &&
                mqtt_client->mqtt_status & MQTT_STATUS_CLIENT_CONNECTED &&
                mqtt_client->keepAliveInterval > 0)
            {
                tickcounter_ms_t current_ms;
                if (tickcounter_get_current_ms(mqtt_client->packetTickCntr, &current_ms) != 0)
                {
                    LogError("Error: tickcounter_get_current_ms failed");
                }
                else
                {
                    /* Codes_SRS_MQTT_CLIENT_07_035: [If the timeSincePing has expired past the maxPingRespTime then mqtt_client_dowork shall call the Error Callback function with the message MQTT_CLIENT_NO_PING_RESPONSE] */
                    if (mqtt_client->timeSincePing > 0 && ((current_ms - mqtt_client->timeSincePing)/1000) > mqtt_client->maxPingRespTime)
                    {
                        // We haven't gotten a ping response in the alloted time
                        set_error_callback(mqtt_client, MQTT_CLIENT_NO_PING_RESPONSE);
                        mqtt_client->timeSincePing = 0;
                        mqtt_client->packetSendTimeMs = 0;
                        mqtt_client->packetState = UNKNOWN_TYPE;
                    }
                    else if (((current_ms - mqtt_client->packetSendTimeMs) / 1000) >= mqtt_client->keepAliveInterval)
                    {
                        /*Codes_SRS_MQTT_CLIENT_07_026: [if keepAliveInternal is > 0 and the send time is greater than the MQTT KeepAliveInterval then it shall construct an MQTT PINGREQ packet.]*/
                        BUFFER_HANDLE pingPacket = mqtt_codec_ping();
                        if (pingPacket != NULL)
                        {
                            size_t size = BUFFER_length(pingPacket);
                            (void)sendPacketItem(mqtt_client, BUFFER_u_char(pingPacket), size);
                            BUFFER_delete(pingPacket);
                            (void)tickcounter_get_current_ms(mqtt_client->packetTickCntr, &mqtt_client->timeSincePing);

                            if (is_trace_enabled(mqtt_client))
                            {
                                STRING_HANDLE trace_log = STRING_construct("PINGREQ");
                                log_outgoing_trace(mqtt_client, trace_log);
                                STRING_delete(trace_log);
                            }
                        }
                    }
                }
            }
        }
    }
}